

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dotlockCheckReservedLock(sqlite3_file *id,int *pResOut)

{
  int iVar1;
  unixFile *pFile;
  int reserved;
  int rc;
  int *pResOut_local;
  sqlite3_file *id_local;
  
  iVar1 = (*aSyscall[2].pCurrent)(id[5].pMethods,0);
  *pResOut = (uint)(iVar1 == 0);
  return 0;
}

Assistant:

static int dotlockCheckReservedLock(sqlite3_file *id, int *pResOut) {
  int rc = SQLITE_OK;
  int reserved = 0;
  unixFile *pFile = (unixFile*)id;

  SimulateIOError( return SQLITE_IOERR_CHECKRESERVEDLOCK; );

  assert( pFile );
  reserved = osAccess((const char*)pFile->lockingContext, 0)==0;
  OSTRACE(("TEST WR-LOCK %d %d %d (dotlock)\n", pFile->h, rc, reserved));
  *pResOut = reserved;
  return rc;
}